

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O3

bool slang::ast::SemanticFacts::isAllowedInModport(SymbolKind kind)

{
  return (bool)((byte)(0x800023 >> ((byte)(kind - Net) & 0x1f)) & kind - Net < 0x18);
}

Assistant:

bool SemanticFacts::isAllowedInModport(SymbolKind kind) {
    switch (kind) {
        case SymbolKind::Net:
        case SymbolKind::Variable:
        case SymbolKind::Subroutine:
        case SymbolKind::ClockingBlock:
            return true;
        default:
            return false;
    }
}